

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::Generate
          (MessageBuilderGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference ppOVar5;
  OneofGeneratorInfo *pOVar6;
  mapped_type *pmVar7;
  char *pcVar8;
  FieldDescriptor *pFVar9;
  ImmutableFieldGenerator *pIVar10;
  string *psVar11;
  int __c;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  AlphaNum *a;
  ulong uVar12;
  ulong extraout_RDX;
  int local_234;
  undefined1 local_230 [4];
  int i_2;
  uint local_20c;
  int local_208;
  int i_1;
  int totalInts;
  int i;
  int totalBits;
  AlphaNum local_1d8;
  string local_1a8;
  allocator local_181;
  key_type local_180;
  allocator local_159;
  key_type local_158;
  OneofDescriptor *local_138;
  OneofDescriptor *oneof;
  iterator __end3;
  iterator __begin3;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageBuilderGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  WriteMessageDocComment(printer,this->descriptor_);
  iVar3 = Descriptor::extension_range_count(this->descriptor_);
  pPVar1 = local_18;
  if (iVar3 < 1) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_a8,this->name_resolver_,this->descriptor_);
    ExtraBuilderInterfaces_abi_cxx11_(&local_c8,(java *)this->descriptor_,descriptor_00);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    io::Printer::
    Print<char[10],std::__cxx11::string,char[17],std::__cxx11::string,char[4],std::__cxx11::string>
              (pPVar1,
               "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
               ,(char (*) [10])0x77c586,&local_a8,(char (*) [17])"extra_interfaces",&local_c8,
               (char (*) [4])0x76cf09,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_38,this->name_resolver_,this->descriptor_);
    ExtraBuilderInterfaces_abi_cxx11_(&local_58,(java *)this->descriptor_,descriptor);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    io::Printer::
    Print<char[10],std::__cxx11::string,char[17],std::__cxx11::string,char[4],std::__cxx11::string>
              (pPVar1,
               "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n      $classname$, Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
               ,(char (*) [10])0x77c586,&local_38,(char (*) [17])"extra_interfaces",&local_58,
               (char (*) [4])0x76cf09,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  io::Printer::Indent(local_18);
  GenerateDescriptorMethods(this,local_18);
  GenerateCommonBuilderMethods(this,local_18);
  bVar2 = Context::HasGeneratedMethods(this->context_,this->descriptor_);
  if (bVar2) {
    GenerateIsInitialized(this,local_18);
    GenerateBuilderParsingMethods(this,local_18);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&__range3);
  __end3 = std::
           set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
           ::begin(&this->oneofs_);
  oneof = (OneofDescriptor *)
          std::
          set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
          ::end(&this->oneofs_);
  while (bVar2 = std::operator!=(&__end3,(_Self *)&oneof), bVar2) {
    ppOVar5 = std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator*
                        (&__end3);
    local_138 = *ppOVar5;
    pOVar6 = Context::GetOneofGeneratorInfo(this->context_,local_138);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"oneof_name",&local_159);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range3,&local_158);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)pOVar6);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    pOVar6 = Context::GetOneofGeneratorInfo(this->context_,local_138);
    psVar11 = &pOVar6->capitalized_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"oneof_capitalized_name",&local_181);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range3,&local_180);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)psVar11);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    pcVar8 = OneofDescriptor::index(local_138,(char *)psVar11,__c);
    strings::AlphaNum::AlphaNum(&local_1d8,(int)pcVar8);
    StrCat_abi_cxx11_(&local_1a8,(protobuf *)&local_1d8,a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&totalBits,"oneof_index",(allocator *)((long)&i + 3));
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range3,(key_type *)&totalBits);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&totalBits);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
    std::__cxx11::string::~string((string *)&local_1a8);
    io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&__range3,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&__range3,
                       "public $oneof_capitalized_name$Case\n    get$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\npublic Builder clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n"
                      );
    io::Printer::Print<>(local_18,"  onChanged();\n");
    io::Printer::Print<>(local_18,"  return this;\n}\n\n");
    std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator++(&__end3);
  }
  totalInts = 0;
  for (i_1 = 0; iVar3 = i_1, iVar4 = Descriptor::field_count(this->descriptor_), iVar3 < iVar4;
      i_1 = i_1 + 1) {
    pFVar9 = Descriptor::field(this->descriptor_,i_1);
    pIVar10 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                        (&this->field_generators_,pFVar9);
    iVar3 = (*pIVar10->_vptr_ImmutableFieldGenerator[3])();
    totalInts = iVar3 + totalInts;
  }
  local_208 = (totalInts + 0x1f) / 0x20;
  uVar12 = (long)(totalInts + 0x1f) % 0x20 & 0xffffffff;
  for (local_20c = 0; pPVar1 = local_18, (int)local_20c < local_208; local_20c = local_20c + 1) {
    GetBitFieldName_abi_cxx11_((string *)local_230,(java *)(ulong)local_20c,(int)uVar12);
    io::Printer::Print<char[15],std::__cxx11::string>
              (pPVar1,"private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    std::__cxx11::string::~string((string *)local_230);
    uVar12 = extraout_RDX;
  }
  for (local_234 = 0; iVar3 = Descriptor::field_count(this->descriptor_), local_234 < iVar3;
      local_234 = local_234 + 1) {
    io::Printer::Print<>(local_18,"\n");
    pFVar9 = Descriptor::field(this->descriptor_,local_234);
    pIVar10 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                        (&this->field_generators_,pFVar9);
    (*pIVar10->_vptr_ImmutableFieldGenerator[6])(pIVar10,local_18);
  }
  io::Printer::Print<>
            (local_18,
             "@java.lang.Override\npublic final Builder setUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.setUnknownFields(unknownFields);\n}\n\n@java.lang.Override\npublic final Builder mergeUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.mergeUnknownFields(unknownFields);\n}\n\n"
            );
  pPVar1 = local_18;
  psVar11 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar1,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n",
             (char (*) [10])0x7872ae,psVar11);
  io::Printer::Outdent(local_18);
  io::Printer::Print<>(local_18,"}\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&__range3);
  return;
}

Assistant:

void MessageBuilderGenerator::Generate(io::Printer* printer) {
  WriteMessageDocComment(printer, descriptor_);
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n"
        "      $classname$, Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "extra_interfaces", ExtraBuilderInterfaces(descriptor_), "ver",
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> "
        "implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "extra_interfaces", ExtraBuilderInterfaces(descriptor_), "ver",
        GeneratedCodeVersionSuffix());
  }
  printer->Indent();

  GenerateDescriptorMethods(printer);
  GenerateCommonBuilderMethods(printer);

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateBuilderParsingMethods(printer);
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (auto oneof : oneofs_) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat(oneof->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // oneofCase() and clearOneof()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "    get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n"
                   "public Builder clear$oneof_capitalized_name$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n");
    printer->Print("  onChanged();\n");
    printer->Print(
        "  return this;\n"
        "}\n"
        "\n");
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForBuilder();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderMembers(printer);
  }

  // Override methods declared in GeneratedMessage to return the concrete
  // generated type so callsites won't depend on GeneratedMessage. This
  // is needed to keep binary compatibility when we change generated code
  // to subclass a different GeneratedMessage class (e.g., in v3.0.0 release
  // we changed all generated code to subclass GeneratedMessageV3).
  printer->Print(
      "@java.lang.Override\n"
      "public final Builder setUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.setUnknownFields(unknownFields);\n"
      "}\n"
      "\n"
      "@java.lang.Override\n"
      "public final Builder mergeUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.mergeUnknownFields(unknownFields);\n"
      "}\n"
      "\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}